

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DiscreteQuantileFunction::Deserialize
          (DiscreteQuantileFunction *this,Deserializer *deserializer,AggregateFunction *function)

{
  pointer pFVar1;
  reference type;
  pointer *__ptr;
  undefined **local_148 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  QuantileBindData::Deserialize((Deserializer *)this,(AggregateFunction *)deserializer);
  pFVar1 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)this);
  type = vector<duckdb::LogicalType,_true>::operator[]
                   ((vector<duckdb::LogicalType,_true> *)&function->field_0x48,0);
  if (*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) == 0x68) {
    GetAggregate((AggregateFunction *)local_148,type);
    AggregateFunction::operator=(function,(AggregateFunction *)local_148);
  }
  else {
    DiscreteQuantileListFunction::GetAggregate((AggregateFunction *)local_148,type);
    AggregateFunction::operator=(function,(AggregateFunction *)local_148);
  }
  local_148[0] = &PTR__AggregateFunction_00897e98;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_148);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto bind_data = QuantileBindData::Deserialize(deserializer, function);
		auto &quantile_data = bind_data->Cast<QuantileBindData>();

		auto &input_type = function.arguments[0];
		if (quantile_data.quantiles.size() == 1) {
			function = GetAggregate(input_type);
		} else {
			function = DiscreteQuantileListFunction::GetAggregate(input_type);
		}
		return bind_data;
	}